

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_swab.c
# Opt level: O1

void TIFFReverseBits(uint8_t *cp,tmsize_t n)

{
  bool bVar1;
  long lVar2;
  
  lVar2 = n;
  if (8 < n) {
    do {
      *cp = ""[*cp];
      cp[1] = ""[cp[1]];
      cp[2] = ""[cp[2]];
      cp[3] = ""[cp[3]];
      cp[4] = ""[cp[4]];
      cp[5] = ""[cp[5]];
      cp[6] = ""[cp[6]];
      cp[7] = ""[cp[7]];
      cp = cp + 8;
      n = lVar2 + -8;
      bVar1 = 0x10 < lVar2;
      lVar2 = n;
    } while (bVar1);
  }
  if (0 < n) {
    lVar2 = n + 1;
    do {
      *cp = ""[*cp];
      cp = cp + 1;
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
  }
  return;
}

Assistant:

void TIFFReverseBits(uint8_t *cp, tmsize_t n)
{
    for (; n > 8; n -= 8)
    {
        cp[0] = TIFFBitRevTable[cp[0]];
        cp[1] = TIFFBitRevTable[cp[1]];
        cp[2] = TIFFBitRevTable[cp[2]];
        cp[3] = TIFFBitRevTable[cp[3]];
        cp[4] = TIFFBitRevTable[cp[4]];
        cp[5] = TIFFBitRevTable[cp[5]];
        cp[6] = TIFFBitRevTable[cp[6]];
        cp[7] = TIFFBitRevTable[cp[7]];
        cp += 8;
    }
    while (n-- > 0)
    {
        *cp = TIFFBitRevTable[*cp];
        cp++;
    }
}